

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O0

void __thiscall
burst::detail::
join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
::prepare_for_decrement
          (join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
           *this)

{
  bool bVar1;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *piVar2;
  int *piVar3;
  int *piVar4;
  join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
  *this_local;
  
  bVar1 = __gnu_cxx::operator==(&this->m_outer,&this->m_end);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::operator--(&this->m_outer);
  }
  while( true ) {
    piVar4 = this->m_inner;
    piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
             __gnu_cxx::
             __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
             ::operator->(&this->m_outer);
    piVar3 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::begin
                       (piVar2);
    if (piVar4 != piVar3) break;
    __gnu_cxx::
    __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::operator--(&this->m_outer);
    piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
             __gnu_cxx::
             __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
             ::operator->(&this->m_outer);
    piVar4 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::end
                       (piVar2);
    this->m_inner = piVar4;
  }
  return;
}

Assistant:

void prepare_for_decrement ()
            {
                if (m_outer == m_end)
                {
                    --m_outer;
                }
                while (m_inner == m_outer->begin())
                {
                    --m_outer;
                    m_inner = m_outer->end();
                }
            }